

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  uint64_t uVar12;
  long lVar13;
  uint_fast16_t uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  Mat a;
  Mat local_638;
  Mat local_5f8;
  Mat local_5b8;
  Mat local_578;
  Mat local_538;
  Mat local_4f8;
  Mat local_4b8;
  Mat local_478;
  Mat local_438;
  Mat local_3f8;
  Mat local_3b8;
  Mat local_378;
  Mat local_338;
  Mat local_2f8;
  Mat local_2b8;
  Mat local_278;
  Mat local_238;
  Mat local_1f8;
  Mat local_1b8;
  Mat local_178;
  Mat local_138;
  Mat local_f8;
  Mat local_b8;
  Mat local_78;
  
  auVar8 = _DAT_00173020;
  auVar7 = _DAT_00173010;
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar12 = 0x1007685db;
  lVar13 = 0;
  do {
    auVar18._8_4_ = (int)lVar13;
    auVar18._0_8_ = lVar13;
    auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
    auVar18 = (auVar18 | auVar7) ^ auVar8;
    if (auVar18._4_4_ == -0x80000000 && auVar18._0_4_ < -0x7fffffc1) {
      g_prng_rand_state.s[lVar13 + 1] = uVar12 - 0x7fffffff;
      g_prng_rand_state.s[lVar13 + 2] = uVar12;
    }
    lVar13 = lVar13 + 2;
    uVar12 = uVar12 + 0xfffffffe;
  } while (lVar13 != 0x40);
  lVar13 = 0;
  do {
    uVar14 = g_prng_rand_state.i;
    uVar15 = 0;
    do {
      iVar10 = (int)uVar14;
      iVar9 = (int)uVar15;
      uVar1 = uVar15 + 1;
      g_prng_rand_state.s[iVar10 + iVar9 & 0x3f] =
           g_prng_rand_state.s[iVar10 + iVar9 + 9U & 0x3f] +
           g_prng_rand_state.s[iVar10 + iVar9 + 0x28U & 0x3f];
      if (g_prng_rand_state.c != 0) break;
      bVar16 = uVar15 < 0x1ef;
      uVar15 = uVar1;
    } while (bVar16);
    bVar16 = g_prng_rand_state.c == 0;
    g_prng_rand_state.c = g_prng_rand_state.c - 1;
    if (bVar16) {
      g_prng_rand_state.c = 0x36;
    }
    lVar13 = lVar13 + 1;
    g_prng_rand_state.i = uVar14 + uVar1;
  } while (lVar13 != 10000);
  g_prng_rand_state.i = uVar14 + uVar1;
  RandomMat(&a,0x10,10000,(int)g_prng_rand_state.c);
  iVar11 = 0;
  iVar9 = test_crop(&a,0,0,0,-0xe9,-0xe9,-0xe9,0,0,0);
  bVar16 = false;
  iVar10 = extraout_EDX;
  if (iVar9 == 0) {
    iVar11 = 0;
    iVar9 = test_crop(&a,0,3,0,10,-0xe9,-0xe9,0,0,0);
    bVar16 = false;
    iVar10 = extraout_EDX_00;
    if (iVar9 == 0) {
      iVar11 = 0;
      iVar9 = test_crop(&a,5,0,0,-0xe9,6,-0xe9,0,0,0);
      bVar16 = false;
      iVar10 = extraout_EDX_01;
      if (iVar9 == 0) {
        iVar11 = 0;
        iVar9 = test_crop(&a,5,3,0,-0xe9,-0xe9,0xc,0,0,0);
        bVar16 = false;
        iVar10 = extraout_EDX_02;
        if (iVar9 == 0) {
          iVar11 = 4;
          iVar9 = test_crop(&a,0,3,4,7,-0xe9,8,0,0,0);
          bVar16 = false;
          iVar10 = extraout_EDX_03;
          if (iVar9 == 0) {
            iVar11 = 5;
            iVar9 = test_crop(&a,5,0,5,4,-0xe9,4,0,0,0);
            bVar16 = false;
            iVar10 = extraout_EDX_04;
            if (iVar9 == 0) {
              iVar11 = 6;
              iVar9 = test_crop(&a,5,3,6,2,7,9,0,0,0);
              bVar16 = false;
              iVar10 = extraout_EDX_05;
              if (iVar9 == 0) {
                iVar11 = 4;
                iVar9 = test_crop(&a,0,3,4,-0xe9,4,5,0,0,0);
                bVar16 = false;
                iVar10 = extraout_EDX_06;
                if (iVar9 == 0) {
                  iVar11 = 5;
                  iVar9 = test_crop(&a,5,0,5,6,6,8,0,0,0);
                  bVar16 = false;
                  iVar10 = extraout_EDX_07;
                  if (iVar9 == 0) {
                    iVar11 = 6;
                    iVar10 = test_crop(&a,5,3,6,4,4,4,0,0,0);
                    bVar16 = iVar10 == 0;
                    iVar10 = extraout_EDX_08;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (a.refcount != (int *)0x0) {
    LOCK();
    *a.refcount = *a.refcount + -1;
    UNLOCK();
    if (*a.refcount == 0) {
      if (a.allocator == (Allocator *)0x0) {
        if (a.data != (void *)0x0) {
          free(a.data);
          iVar10 = extraout_EDX_10;
        }
      }
      else {
        (**(code **)(*(long *)a.allocator + 0x18))();
        iVar10 = extraout_EDX_09;
      }
    }
  }
  if (!bVar16) {
    return 1;
  }
  RandomMat(&a,0x10,iVar10,iVar11);
  iVar11 = 0;
  iVar9 = test_crop(&a,0,0,0,-0xe9,-0xe9,-0xe9,3,4,6);
  iVar10 = extraout_EDX_11;
  if (iVar9 == 0) {
    iVar11 = 0;
    iVar9 = test_crop(&a,0,3,0,10,-0xe9,-0xe9,0,3,4);
    iVar10 = extraout_EDX_12;
    if (iVar9 != 0) goto LAB_00112d6c;
    iVar11 = 0;
    iVar9 = test_crop(&a,5,0,0,-0xe9,6,-0xe9,5,0,2);
    iVar10 = extraout_EDX_13;
    if (iVar9 != 0) goto LAB_00112d6c;
    iVar11 = 0;
    iVar9 = test_crop(&a,5,3,0,-0xe9,-0xe9,0xc,2,1,1);
    iVar10 = extraout_EDX_14;
    if (iVar9 != 0) goto LAB_00112d6c;
    iVar11 = 4;
    iVar9 = test_crop(&a,0,3,4,7,-0xe9,8,3,4,4);
    bVar16 = false;
    iVar10 = extraout_EDX_23;
    if (iVar9 == 0) {
      iVar11 = 5;
      iVar9 = test_crop(&a,5,0,5,4,-0xe9,4,0,3,0);
      iVar10 = extraout_EDX_24;
      if (iVar9 == 0) {
        iVar11 = 6;
        iVar9 = test_crop(&a,5,3,6,2,7,9,1,2,3);
        iVar10 = extraout_EDX_25;
        if (iVar9 == 0) {
          iVar11 = 4;
          iVar10 = test_crop(&a,0,3,4,-0xe9,4,5,3,2,1);
          bVar16 = iVar10 == 0;
          iVar10 = extraout_EDX_26;
          goto LAB_00112d6f;
        }
      }
      goto LAB_00112d6c;
    }
  }
  else {
LAB_00112d6c:
    bVar16 = false;
  }
LAB_00112d6f:
  if (a.refcount != (int *)0x0) {
    LOCK();
    *a.refcount = *a.refcount + -1;
    UNLOCK();
    if (*a.refcount == 0) {
      if (a.allocator == (Allocator *)0x0) {
        if (a.data != (void *)0x0) {
          free(a.data);
          iVar10 = extraout_EDX_16;
        }
      }
      else {
        (**(code **)(*(long *)a.allocator + 0x18))();
        iVar10 = extraout_EDX_15;
      }
    }
  }
  if (!bVar16) {
    return 1;
  }
  RandomMat(&a,0x11,iVar10,iVar11);
  iVar11 = 0;
  iVar9 = test_crop(&a,0,0,0,-0xe9,-0xe9,-0xe9,3,4,6);
  iVar10 = extraout_EDX_17;
  if (iVar9 == 0) {
    iVar11 = 0;
    iVar9 = test_crop(&a,0,3,0,10,-0xe9,-0xe9,0,3,4);
    iVar10 = extraout_EDX_18;
    if (iVar9 != 0) goto LAB_00112e8b;
    iVar11 = 0;
    iVar9 = test_crop(&a,5,0,0,-0xe9,6,-0xe9,5,0,2);
    iVar10 = extraout_EDX_19;
    if (iVar9 != 0) goto LAB_00112e8b;
    iVar11 = 0;
    iVar9 = test_crop(&a,5,3,0,-0xe9,-0xe9,0xc,2,1,1);
    iVar10 = extraout_EDX_20;
    if (iVar9 != 0) goto LAB_00112e8b;
    iVar11 = 4;
    iVar9 = test_crop(&a,0,3,4,7,-0xe9,8,3,4,4);
    bVar16 = false;
    iVar10 = extraout_EDX_27;
    if (iVar9 == 0) {
      iVar11 = 5;
      iVar9 = test_crop(&a,5,0,5,4,-0xe9,4,0,3,0);
      iVar10 = extraout_EDX_28;
      if (iVar9 == 0) {
        iVar11 = 6;
        iVar9 = test_crop(&a,5,3,6,2,7,9,1,2,3);
        iVar10 = extraout_EDX_29;
        if (iVar9 == 0) {
          iVar11 = 4;
          iVar10 = test_crop(&a,0,3,4,-0xe9,4,5,3,2,1);
          bVar16 = iVar10 == 0;
          iVar10 = extraout_EDX_30;
          goto LAB_00112e8e;
        }
      }
      goto LAB_00112e8b;
    }
  }
  else {
LAB_00112e8b:
    bVar16 = false;
  }
LAB_00112e8e:
  if (a.refcount != (int *)0x0) {
    LOCK();
    *a.refcount = *a.refcount + -1;
    UNLOCK();
    if (*a.refcount == 0) {
      if (a.allocator == (Allocator *)0x0) {
        if (a.data != (void *)0x0) {
          free(a.data);
          iVar10 = extraout_EDX_22;
        }
      }
      else {
        (**(code **)(*(long *)a.allocator + 0x18))();
        iVar10 = extraout_EDX_21;
      }
    }
  }
  if (!bVar16) {
    return 1;
  }
  RandomMat(&a,0x10,iVar10,iVar11);
  IntArrayMat(&local_78,0,0,0);
  IntArrayMat(&local_b8,100,100,100);
  IntArrayMat(&local_f8,0,1,2);
  iVar10 = test_crop(&a,&local_78,&local_b8,&local_f8);
  if (iVar10 == 0) {
    IntArrayMat(&local_138,4);
    IntArrayMat(&local_178,8);
    IntArrayMat(&local_1b8,0);
    iVar9 = test_crop(&a,&local_138,&local_178,&local_1b8);
    if (iVar9 != 0) goto LAB_00112fa2;
    IntArrayMat(&local_1f8,2);
    IntArrayMat(&local_238,7);
    IntArrayMat(&local_278,1);
    iVar9 = test_crop(&a,&local_1f8,&local_238,&local_278);
    if (iVar9 != 0) {
      bVar16 = true;
      goto LAB_00112fa5;
    }
    IntArrayMat(&local_2b8,3);
    IntArrayMat(&local_2f8,5);
    IntArrayMat(&local_338,2);
    iVar9 = test_crop(&a,&local_2b8,&local_2f8,&local_338);
    if (iVar9 != 0) {
      bVar16 = true;
      bVar6 = true;
      goto LAB_00112fab;
    }
    IntArrayMat(&local_378,2,1);
    IntArrayMat(&local_3b8,4,-2);
    IntArrayMat(&local_3f8,0,1);
    iVar9 = test_crop(&a,&local_378,&local_3b8,&local_3f8);
    if (iVar9 != 0) {
      bVar16 = true;
      bVar6 = true;
      bVar5 = true;
      goto LAB_00112fae;
    }
    IntArrayMat(&local_438,1,4);
    IntArrayMat(&local_478,-5,7);
    IntArrayMat(&local_4b8,1,-3);
    iVar9 = test_crop(&a,&local_438,&local_478,&local_4b8);
    if (iVar9 != 0) {
      bVar16 = true;
      bVar6 = true;
      bVar5 = true;
      bVar4 = true;
      goto LAB_00112fb0;
    }
    IntArrayMat(&local_4f8,2,1);
    IntArrayMat(&local_538,4,-2);
    IntArrayMat(&local_578,-1,-2);
    iVar9 = test_crop(&a,&local_4f8,&local_538,&local_578);
    if (iVar9 == 0) {
      IntArrayMat(&local_5b8,1,2,3);
      IntArrayMat(&local_5f8,-3,-2,-1);
      IntArrayMat(&local_638,-3,-2,-1);
      iVar9 = test_crop(&a,&local_5b8,&local_5f8,&local_638);
      bVar17 = iVar9 == 0;
      bVar16 = true;
      bVar6 = true;
      bVar5 = true;
      bVar4 = true;
      bVar3 = true;
      bVar2 = true;
      goto LAB_00112fba;
    }
    bVar16 = true;
    bVar6 = true;
    bVar5 = true;
    bVar4 = true;
    bVar3 = true;
  }
  else {
LAB_00112fa2:
    bVar16 = false;
LAB_00112fa5:
    bVar6 = false;
LAB_00112fab:
    bVar5 = false;
LAB_00112fae:
    bVar4 = false;
LAB_00112fb0:
    bVar3 = false;
  }
  bVar2 = false;
  bVar17 = false;
LAB_00112fba:
  if (bVar2) {
    if (local_638.refcount != (int *)0x0) {
      LOCK();
      *local_638.refcount = *local_638.refcount + -1;
      UNLOCK();
      if (*local_638.refcount == 0) {
        if (local_638.allocator == (Allocator *)0x0) {
          if (local_638.data != (void *)0x0) {
            free(local_638.data);
          }
        }
        else {
          (**(code **)(*(long *)local_638.allocator + 0x18))();
        }
      }
    }
    if (local_5f8.refcount != (int *)0x0) {
      LOCK();
      *local_5f8.refcount = *local_5f8.refcount + -1;
      UNLOCK();
      if (*local_5f8.refcount == 0) {
        if (local_5f8.allocator == (Allocator *)0x0) {
          if (local_5f8.data != (void *)0x0) {
            free(local_5f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_5f8.allocator + 0x18))();
        }
      }
    }
    if (local_5b8.refcount != (int *)0x0) {
      LOCK();
      *local_5b8.refcount = *local_5b8.refcount + -1;
      UNLOCK();
      if (*local_5b8.refcount == 0) {
        if (local_5b8.allocator == (Allocator *)0x0) {
          if (local_5b8.data != (void *)0x0) {
            free(local_5b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_5b8.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar3) {
    if (local_578.refcount != (int *)0x0) {
      LOCK();
      *local_578.refcount = *local_578.refcount + -1;
      UNLOCK();
      if (*local_578.refcount == 0) {
        if (local_578.allocator == (Allocator *)0x0) {
          if (local_578.data != (void *)0x0) {
            free(local_578.data);
          }
        }
        else {
          (**(code **)(*(long *)local_578.allocator + 0x18))();
        }
      }
    }
    if (local_538.refcount != (int *)0x0) {
      LOCK();
      *local_538.refcount = *local_538.refcount + -1;
      UNLOCK();
      if (*local_538.refcount == 0) {
        if (local_538.allocator == (Allocator *)0x0) {
          if (local_538.data != (void *)0x0) {
            free(local_538.data);
          }
        }
        else {
          (**(code **)(*(long *)local_538.allocator + 0x18))();
        }
      }
    }
    if (local_4f8.refcount != (int *)0x0) {
      LOCK();
      *local_4f8.refcount = *local_4f8.refcount + -1;
      UNLOCK();
      if (*local_4f8.refcount == 0) {
        if (local_4f8.allocator == (Allocator *)0x0) {
          if (local_4f8.data != (void *)0x0) {
            free(local_4f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_4f8.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar4) {
    if (local_4b8.refcount != (int *)0x0) {
      LOCK();
      *local_4b8.refcount = *local_4b8.refcount + -1;
      UNLOCK();
      if (*local_4b8.refcount == 0) {
        if (local_4b8.allocator == (Allocator *)0x0) {
          if (local_4b8.data != (void *)0x0) {
            free(local_4b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_4b8.allocator + 0x18))();
        }
      }
    }
    if (local_478.refcount != (int *)0x0) {
      LOCK();
      *local_478.refcount = *local_478.refcount + -1;
      UNLOCK();
      if (*local_478.refcount == 0) {
        if (local_478.allocator == (Allocator *)0x0) {
          if (local_478.data != (void *)0x0) {
            free(local_478.data);
          }
        }
        else {
          (**(code **)(*(long *)local_478.allocator + 0x18))();
        }
      }
    }
    if (local_438.refcount != (int *)0x0) {
      LOCK();
      *local_438.refcount = *local_438.refcount + -1;
      UNLOCK();
      if (*local_438.refcount == 0) {
        if (local_438.allocator == (Allocator *)0x0) {
          if (local_438.data != (void *)0x0) {
            free(local_438.data);
          }
        }
        else {
          (**(code **)(*(long *)local_438.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar5) {
    if (local_3f8.refcount != (int *)0x0) {
      LOCK();
      *local_3f8.refcount = *local_3f8.refcount + -1;
      UNLOCK();
      if (*local_3f8.refcount == 0) {
        if (local_3f8.allocator == (Allocator *)0x0) {
          if (local_3f8.data != (void *)0x0) {
            free(local_3f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_3f8.allocator + 0x18))();
        }
      }
    }
    if (local_3b8.refcount != (int *)0x0) {
      LOCK();
      *local_3b8.refcount = *local_3b8.refcount + -1;
      UNLOCK();
      if (*local_3b8.refcount == 0) {
        if (local_3b8.allocator == (Allocator *)0x0) {
          if (local_3b8.data != (void *)0x0) {
            free(local_3b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_3b8.allocator + 0x18))();
        }
      }
    }
    if (local_378.refcount != (int *)0x0) {
      LOCK();
      *local_378.refcount = *local_378.refcount + -1;
      UNLOCK();
      if (*local_378.refcount == 0) {
        if (local_378.allocator == (Allocator *)0x0) {
          if (local_378.data != (void *)0x0) {
            free(local_378.data);
          }
        }
        else {
          (**(code **)(*(long *)local_378.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar6) {
    if (local_338.refcount != (int *)0x0) {
      LOCK();
      *local_338.refcount = *local_338.refcount + -1;
      UNLOCK();
      if (*local_338.refcount == 0) {
        if (local_338.allocator == (Allocator *)0x0) {
          if (local_338.data != (void *)0x0) {
            free(local_338.data);
          }
        }
        else {
          (**(code **)(*(long *)local_338.allocator + 0x18))();
        }
      }
    }
    if (local_2f8.refcount != (int *)0x0) {
      LOCK();
      *local_2f8.refcount = *local_2f8.refcount + -1;
      UNLOCK();
      if (*local_2f8.refcount == 0) {
        if (local_2f8.allocator == (Allocator *)0x0) {
          if (local_2f8.data != (void *)0x0) {
            free(local_2f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_2f8.allocator + 0x18))();
        }
      }
    }
    if (local_2b8.refcount != (int *)0x0) {
      LOCK();
      *local_2b8.refcount = *local_2b8.refcount + -1;
      UNLOCK();
      if (*local_2b8.refcount == 0) {
        if (local_2b8.allocator == (Allocator *)0x0) {
          if (local_2b8.data != (void *)0x0) {
            free(local_2b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_2b8.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar16) {
    if (local_278.refcount != (int *)0x0) {
      LOCK();
      *local_278.refcount = *local_278.refcount + -1;
      UNLOCK();
      if (*local_278.refcount == 0) {
        if (local_278.allocator == (Allocator *)0x0) {
          if (local_278.data != (void *)0x0) {
            free(local_278.data);
          }
        }
        else {
          (**(code **)(*(long *)local_278.allocator + 0x18))();
        }
      }
    }
    if (local_238.refcount != (int *)0x0) {
      LOCK();
      *local_238.refcount = *local_238.refcount + -1;
      UNLOCK();
      if (*local_238.refcount == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if (local_238.data != (void *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (**(code **)(*(long *)local_238.allocator + 0x18))();
        }
      }
    }
    if (local_1f8.refcount != (int *)0x0) {
      LOCK();
      *local_1f8.refcount = *local_1f8.refcount + -1;
      UNLOCK();
      if (*local_1f8.refcount == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          if (local_1f8.data != (void *)0x0) {
            free(local_1f8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_1f8.allocator + 0x18))();
        }
      }
    }
  }
  if (iVar10 == 0) {
    if (local_1b8.refcount != (int *)0x0) {
      LOCK();
      *local_1b8.refcount = *local_1b8.refcount + -1;
      UNLOCK();
      if (*local_1b8.refcount == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_1b8.allocator + 0x18))();
        }
      }
    }
    if (local_178.refcount != (int *)0x0) {
      LOCK();
      *local_178.refcount = *local_178.refcount + -1;
      UNLOCK();
      if (*local_178.refcount == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (**(code **)(*(long *)local_178.allocator + 0x18))();
        }
      }
    }
    if (local_138.refcount != (int *)0x0) {
      LOCK();
      *local_138.refcount = *local_138.refcount + -1;
      UNLOCK();
      if (*local_138.refcount == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if (local_138.data != (void *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (**(code **)(*(long *)local_138.allocator + 0x18))();
        }
      }
    }
  }
  if (local_f8.refcount != (int *)0x0) {
    LOCK();
    *local_f8.refcount = *local_f8.refcount + -1;
    UNLOCK();
    if (*local_f8.refcount == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_f8.allocator + 0x18))();
      }
    }
  }
  if (local_b8.refcount != (int *)0x0) {
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (**(code **)(*(long *)local_78.allocator + 0x18))();
      }
    }
  }
  if (a.refcount != (int *)0x0) {
    LOCK();
    *a.refcount = *a.refcount + -1;
    UNLOCK();
    if (*a.refcount == 0) {
      if (a.allocator == (Allocator *)0x0) {
        if (a.data != (void *)0x0) {
          free(a.data);
        }
      }
      else {
        (**(code **)(*(long *)a.allocator + 0x18))();
      }
    }
  }
  iVar10 = 1;
  if (bVar17) {
    iVar10 = test_crop_4();
  }
  return iVar10;
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_crop_0()
        || test_crop_1()
        || test_crop_2()
        || test_crop_3()
        || test_crop_4()
        ;
}